

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O2

bool __thiscall
deqp::RobustBufferAccessBehavior::UniformBufferTest::verifyResults
          (UniformBufferTest *this,GLfloat *buffer_data)

{
  ostringstream *this_00;
  GLfloat *pGVar1;
  TestError *this_01;
  char *pcVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 local_1a0 [384];
  
  if (this->m_test_case == VALID) {
    pGVar1 = verifyResults::expected_data_valid;
    pcVar2 = "valid indices";
  }
  else {
    if (this->m_test_case != SOURCE_INVALID) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                 ,0xe4a);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pGVar1 = verifyResults::expected_data_invalid_source;
    pcVar2 = "invalid source indices";
  }
  auVar4[0] = -(*(char *)pGVar1 == *(char *)buffer_data);
  auVar4[1] = -(*(char *)((long)pGVar1 + 1) == *(char *)((long)buffer_data + 1));
  auVar4[2] = -(*(char *)((long)pGVar1 + 2) == *(char *)((long)buffer_data + 2));
  auVar4[3] = -(*(char *)((long)pGVar1 + 3) == *(char *)((long)buffer_data + 3));
  auVar4[4] = -(*(char *)(pGVar1 + 1) == *(char *)(buffer_data + 1));
  auVar4[5] = -(*(char *)((long)pGVar1 + 5) == *(char *)((long)buffer_data + 5));
  auVar4[6] = -(*(char *)((long)pGVar1 + 6) == *(char *)((long)buffer_data + 6));
  auVar4[7] = -(*(char *)((long)pGVar1 + 7) == *(char *)((long)buffer_data + 7));
  auVar4[8] = -(*(char *)(pGVar1 + 2) == *(char *)(buffer_data + 2));
  auVar4[9] = -(*(char *)((long)pGVar1 + 9) == *(char *)((long)buffer_data + 9));
  auVar4[10] = -(*(char *)((long)pGVar1 + 10) == *(char *)((long)buffer_data + 10));
  auVar4[0xb] = -(*(char *)((long)pGVar1 + 0xb) == *(char *)((long)buffer_data + 0xb));
  auVar4[0xc] = -(*(char *)(pGVar1 + 3) == *(char *)(buffer_data + 3));
  auVar4[0xd] = -(*(char *)((long)pGVar1 + 0xd) == *(char *)((long)buffer_data + 0xd));
  auVar4[0xe] = -(*(char *)((long)pGVar1 + 0xe) == *(char *)((long)buffer_data + 0xe));
  auVar4[0xf] = -(*(char *)((long)pGVar1 + 0xf) == *(char *)((long)buffer_data + 0xf));
  bVar3 = (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe | (ushort)(auVar4[0xf] >> 7) << 0xf
                  ) == 0xffff;
  if (!bVar3) {
    local_1a0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Test case: ");
    std::operator<<((ostream *)this_00,pcVar2);
    std::operator<<((ostream *)this_00," failed");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return bVar3;
}

Assistant:

bool UniformBufferTest::verifyResults(GLfloat* buffer_data)
{
	static const GLfloat expected_data_valid[4]			 = { 2.0f, 3.0f, 4.0f, 5.0f };
	static const GLfloat expected_data_invalid_source[4] = { 0.0f, 0.0f, 0.0f, 0.0f };

	int size = static_cast<int>(sizeof(GLfloat) * 4);

	/* Prepare expected data const for proper case*/
	const GLfloat* expected_data = 0;
	const GLchar*  name			 = 0;
	switch (m_test_case)
	{
	case VALID:
		expected_data = expected_data_valid;
		name		  = "valid indices";
		break;
	case SOURCE_INVALID:
		expected_data = expected_data_invalid_source;
		name		  = "invalid source indices";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	/* Verify buffer data */
	if (0 != memcmp(expected_data, buffer_data, size))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Test case: " << name << " failed"
											<< tcu::TestLog::EndMessage;
		return false;
	}

	return true;
}